

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_Parse_multi_Test::TestBody(Descriptor_Parse_multi_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_608;
  Message local_600;
  int local_5f8;
  uint32_t local_5f4;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_5c0;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__1;
  Message local_590;
  Script local_588;
  string local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_;
  Message local_4d0;
  int local_4c4;
  size_type local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_2;
  Message local_4a0;
  string local_498;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_1;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar;
  Message local_440;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_438;
  AssertHelper local_420;
  Message local_418;
  string local_410;
  AssertHelper local_3f0;
  Message local_3e8;
  Script local_3e0;
  AssertHelper local_3a8;
  Message local_3a0 [2];
  Descriptor local_390;
  undefined1 local_228 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_multi_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "multi(1,022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4,025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc)"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&script_list.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_list.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)local_228);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_390,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_390);
      cfd::core::Descriptor::~Descriptor(&local_390);
    }
  }
  else {
    testing::Message::Message(local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,199,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::Message::~Message(local_3a0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_3e0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_3e0);
      cfd::core::Script::~Script(&local_3e0);
    }
  }
  else {
    testing::Message::Message(&local_3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,200,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message(&local_3e8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_410,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_410);
      std::__cxx11::string::~string((string *)&local_410);
    }
  }
  else {
    testing::Message::Message(&local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0xc9,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message(&local_418);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_438,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_228,&local_438);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_438);
    }
  }
  else {
    testing::Message::Message(&local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0xca,
               "Expected: script_list = desc.GetReferenceAll() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_440);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_458,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  cfd::core::Script::ToString_abi_cxx11_(&local_498,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_478,"locking_script.ToString().c_str()",
             "\"1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG\""
             ,pcVar2,
             "1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG"
            );
  std::__cxx11::string::~string((string *)&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  local_4c0 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)local_228);
  local_4c4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_4b8,"script_list.size()","1",&local_4c0,&local_4c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  sVar3 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_228);
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_228,0);
    bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(pvVar4);
    local_4e9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
    if (!bVar1) {
      testing::Message::Message(&local_4f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_3.message_,(internal *)local_4e8,
                 (AssertionResult *)"script_list[0].HasRedeemScript()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0xd0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_4f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_228,0);
    cfd::core::DescriptorScriptReference::GetLockingScript(&local_588,pvVar4);
    cfd::core::Script::ToString_abi_cxx11_(&local_550,&local_588);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_530,"script_list[0].GetLockingScript().ToString().c_str()",
               "\"1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG\""
               ,pcVar2,
               "1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG"
              );
    std::__cxx11::string::~string((string *)&local_550);
    cfd::core::Script::~Script(&local_588);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
    if (!bVar1) {
      testing::Message::Message(&local_590);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0xd2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_590);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_590);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_228,0);
    local_5a9 = cfd::core::DescriptorScriptReference::HasReqNum(pvVar4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_5a8,&local_5a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
    if (!bVar1) {
      testing::Message::Message(&local_5b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_4.message_,(internal *)local_5a8,
                 (AssertionResult *)"script_list[0].HasReqNum()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0xd3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
      testing::internal::AssertHelper::~AssertHelper(&local_5c0);
      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_5b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_228,0);
    local_5f4 = cfd::core::DescriptorScriptReference::GetReqNum(pvVar4);
    local_5f8 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((EqHelper<false> *)local_5f0,"script_list[0].GetReqNum()","1",&local_5f4,&local_5f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
    if (!bVar1) {
      testing::Message::Message(&local_600);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_608,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0xd4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_608,&local_600);
      testing::internal::AssertHelper::~AssertHelper(&local_608);
      testing::Message::~Message(&local_600);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  }
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_228);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_multi) {
  std::string descriptor = "multi(1,022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4,025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  std::vector<DescriptorScriptReference> script_list;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG");
  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_FALSE(script_list[0].HasRedeemScript());
    EXPECT_STREQ(script_list[0].GetLockingScript().ToString().c_str(),
        "1 022f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4 025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc 2 OP_CHECKMULTISIG");
    EXPECT_TRUE(script_list[0].HasReqNum());
    EXPECT_EQ(script_list[0].GetReqNum(), 1);
  }
}